

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O2

bool __thiscall RigidBodyDynamics::ConstraintSet::Bind(ConstraintSet *this,Model *model)

{
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *_this;
  pointer pBVar1;
  pointer pBVar2;
  ostream *poVar3;
  ulong rows;
  int iVar4;
  ulong __new_size;
  allocator_type local_99;
  HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_98;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_58;
  undefined8 local_50;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_40 [8];
  undefined8 local_38;
  
  if (this[4] != (ConstraintSet)0x1) {
    iVar4 = (int)*(ulong *)(this + 0x70);
    __new_size = *(ulong *)(this + 0x70) & 0xffffffff;
    Eigen::internal::
    conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
    ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0xa8),
          (ulong)model->dof_count,(ulong)model->dof_count);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0xa8));
    Eigen::internal::
    conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
    ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0xc0),
          (ulong)model->dof_count);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0xc0));
    Eigen::internal::
    conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
    ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0xd0),__new_size);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0xd0));
    _this = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0xe0);
    Eigen::internal::
    conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
    ::run(_this,__new_size,(ulong)model->dof_count);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero(_this);
    rows = (ulong)(model->dof_count + iVar4);
    Eigen::internal::
    conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
    ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0xf8),rows,rows);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0xf8));
    Eigen::internal::
    conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
    ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x110),
          (ulong)(model->dof_count + iVar4));
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x110));
    Eigen::internal::
    conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
    ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x120),
          (ulong)(iVar4 + model->dof_count));
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x120));
    local_58 = _this;
    Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    HouseholderQR<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_98,
               (EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_58)
    ;
    Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator=
              ((HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x130),&local_98)
    ;
    Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~HouseholderQR(&local_98);
    local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         = (double *)(ulong)model->dof_count;
    local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
         = 0;
    local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
         = (Index)local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)(this + 0x170),
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                *)&local_98);
    local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         = (double *)(ulong)model->dof_count;
    local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
         = *(Index *)(this + 0xe8);
    local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
         = 0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)(this + 0x188),
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                *)&local_98);
    local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         = (double *)(ulong)model->dof_count;
    local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
         = (long)local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data - *(long *)(this + 0xe8);
    local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
         = 0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)(this + 0x1a0),
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                *)&local_98);
    local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         = (double *)(ulong)model->dof_count;
    local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
         = 0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)(this + 0x1b8),
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&local_98);
    local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         = (double *)(ulong)model->dof_count;
    local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
         = 0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)(this + 0x1c8),
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&local_98);
    Eigen::internal::
    conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
    ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x1d8),__new_size,
          __new_size);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x1d8));
    Eigen::internal::
    conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
    ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x1f0),__new_size);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x1f0));
    Eigen::internal::
    conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
    ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x200),
          (ulong)model->dof_count);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x200));
    Eigen::internal::
    conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
    ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x210),
          (ulong)model->dof_count);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x210));
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::resize
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(this + 0x220)
               ,__new_size,(value_type *)Math::SpatialVectorZero);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::resize
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(this + 0x238)
               ,((long)(model->mBodies).
                       super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x70,
               (value_type *)Math::SpatialVectorZero);
    local_50 = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_98,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_58);
    std::vector<Vector3_t,_std::allocator<Vector3_t>_>::resize
              ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(this + 0x250),__new_size,
               (value_type *)&local_98);
    std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::vector
              ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)&local_98,
               ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(model->mBodies).
                     super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x70,
               (value_type *)Math::SpatialVectorZero);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator=
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(this + 0x268)
               ,(vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)&local_98);
    free(local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data);
    std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::vector
              ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)&local_98,
               ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(model->mBodies).
                     super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x70,
               (value_type *)Math::SpatialVectorZero);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator=
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(this + 0x280)
               ,(vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)&local_98);
    free(local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data);
    local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         = (double *)
           (((long)(model->mBodies).
                   super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x70);
    local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
         = 0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)(this + 0x298),
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&local_98);
    std::vector<SpatialMatrix_t,_std::allocator<SpatialMatrix_t>_>::vector
              ((vector<SpatialMatrix_t,_std::allocator<SpatialMatrix_t>_> *)&local_98,
               ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(model->mBodies).
                     super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x70,
               (value_type *)Math::SpatialMatrixIdentity);
    std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::operator=
              ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)(this + 0x2a8)
               ,(vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)&local_98);
    free(local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data);
    std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::vector
              ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)&local_98,
               ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(model->mBodies).
                     super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x70,
               (value_type *)Math::SpatialVectorZero);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator=
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(this + 0x2c0)
               ,(vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)&local_98);
    free(local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data);
    local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         = (double *)
           (((long)(model->mBodies).
                   super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x70);
    local_98.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
         = 0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)(this + 0x2d8),
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&local_98);
    pBVar1 = (model->mBodies).
             super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
             .
             super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pBVar2 = (model->mBodies).
             super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
             .
             super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_38 = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_58,local_40);
    std::vector<Vector3_t,_std::allocator<Vector3_t>_>::vector
              ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)&local_98,
               ((long)pBVar1 - (long)pBVar2) / 0x70,(value_type *)&local_58,&local_99);
    std::vector<Vector3_t,_std::allocator<Vector3_t>_>::_M_move_assign
              ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(this + 0x2e8),&local_98);
    std::_Vector_base<Vector3_t,_std::allocator<Vector3_t>_>::~_Vector_base
              ((_Vector_base<Vector3_t,_std::allocator<Vector3_t>_> *)&local_98);
    this[4] = (ConstraintSet)0x1;
    return true;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Error: binding an already bound constraint set!");
  std::endl<char,std::char_traits<char>>(poVar3);
  abort();
}

Assistant:

bool ConstraintSet::Bind (const Model &model) {
	assert (bound == false);

	if (bound) {
		std::cerr << "Error: binding an already bound constraint set!" << std::endl;
		abort();
	}
	unsigned int n_constr = size();

	H.conservativeResize (model.dof_count, model.dof_count);
	H.setZero();
	C.conservativeResize (model.dof_count);
	C.setZero();
	gamma.conservativeResize (n_constr);
	gamma.setZero();
	G.conservativeResize (n_constr, model.dof_count);
	G.setZero();
	A.conservativeResize (model.dof_count + n_constr, model.dof_count + n_constr);
	A.setZero();
	b.conservativeResize (model.dof_count + n_constr);
	b.setZero();
	x.conservativeResize (model.dof_count + n_constr);
	x.setZero();

#ifdef RBDL_USE_SIMPLE_MATH
	GT_qr = SimpleMath::HouseholderQR<Math::MatrixNd> (G.transpose());
#else
	GT_qr = Eigen::HouseholderQR<Math::MatrixNd> (G.transpose());
#endif
	GT_qr_Q = MatrixNd::Zero (model.dof_count, model.dof_count);
	Y = MatrixNd::Zero (model.dof_count, G.rows());
	Z = MatrixNd::Zero (model.dof_count, model.dof_count - G.rows());
	qddot_y = VectorNd::Zero (model.dof_count);
	qddot_z = VectorNd::Zero (model.dof_count);

	K.conservativeResize (n_constr, n_constr);
	K.setZero();
	a.conservativeResize (n_constr);
	a.setZero();
	QDDot_t.conservativeResize (model.dof_count);
	QDDot_t.setZero();
	QDDot_0.conservativeResize (model.dof_count);
	QDDot_0.setZero();
	f_t.resize (n_constr, SpatialVectorZero);
	f_ext_constraints.resize (model.mBodies.size(), SpatialVectorZero);
	point_accel_0.resize (n_constr, Vector3d::Zero());

	d_pA = std::vector<SpatialVector> (model.mBodies.size(), SpatialVectorZero);
	d_a = std::vector<SpatialVector> (model.mBodies.size(), SpatialVectorZero);
	d_u = VectorNd::Zero (model.mBodies.size());

	d_IA = std::vector<SpatialMatrix> (model.mBodies.size(), SpatialMatrixIdentity);
	d_U = std::vector<SpatialVector> (model.mBodies.size(), SpatialVectorZero);
	d_d = VectorNd::Zero (model.mBodies.size());

	d_multdof3_u = std::vector<Math::Vector3d> (model.mBodies.size(), Math::Vector3d::Zero());

	bound = true;

	return bound;
}